

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void cleanup(EVP_PKEY_CTX *ctx)

{
  void *in_RSI;
  
  shmdt(in_RSI);
  shmctl((int)ctx,0,(shmid_ds *)0x0);
  return;
}

Assistant:

void cleanup(int segment_id, char* shared_memory) {
	// Detach the shared memory from this process' address space.
	// If this is the last process using this shared memory, it is removed.
	shmdt(shared_memory);

	/*
		Deallocate manually for security. We pass:
			1. The shared memory ID returned by shmget.
			2. The IPC_RMID flag to schedule removal/deallocation
				 of the shared memory.
			3. NULL to the last struct parameter, as it is not relevant
				 for deletion (it is populated with certain fields for other
				 calls, notably IPC_STAT, where you would pass a struct shmid_ds*).
	*/
	shmctl(segment_id, IPC_RMID, NULL);
}